

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

void __thiscall slang::SourceManager::addSystemDirectory(SourceManager *this,string_view path)

{
  char *extraout_RDX;
  string_view str;
  string_view local_90;
  path local_80;
  path local_58;
  undefined1 local_30 [8];
  unique_lock<std::shared_mutex> lock;
  SourceManager *this_local;
  string_view path_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)local_30,&this->mut);
  str._M_str = extraout_RDX;
  str._M_len = (size_t)path._M_str;
  local_90 = widen((slang *)path._M_len,str);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_80,&local_90,auto_format);
  std::filesystem::canonical(&local_58);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  push_back(&this->systemDirectories,&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path(&local_80);
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)local_30);
  return;
}

Assistant:

void SourceManager::addSystemDirectory(string_view path) {
    std::unique_lock lock(mut);
    systemDirectories.push_back(fs::canonical(widen(path)));
}